

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_all.cpp
# Opt level: O2

void test_assignment_out(void)

{
  size_t __size;
  void *__ptr;
  runtime_error *this;
  int connections [8];
  float score_graph [16];
  
  __size = trt_pose::parse::assignment_out_workspace(4);
  __ptr = malloc(__size);
  score_graph[0xc] = 0.0;
  score_graph[0xd] = 0.0;
  score_graph[0xe] = 0.0;
  score_graph[0xf] = 0.0;
  score_graph[8] = 4.0;
  score_graph[9] = 3.0;
  score_graph[10] = 4.0;
  score_graph[0xb] = 0.0;
  score_graph[4] = 1.0;
  score_graph[5] = 2.0;
  score_graph[6] = 1.0;
  score_graph[7] = 0.0;
  score_graph[0] = 1.0;
  score_graph[1] = 3.0;
  score_graph[2] = 0.0;
  score_graph[3] = 0.0;
  trt_pose::parse::assignment_out(connections,score_graph,3,3,4,0.3,__ptr);
  if (connections[0] == 1) {
    if (connections[1] == 0) {
      if (connections[2] == 2) {
        free(__ptr);
        return;
      }
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"connections[0] should be 1.");
    }
    else {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"connections[0] should be 1.");
    }
  }
  else {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"connections[0] should be 1.");
  }
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void test_assignment_out()
{
  const int M = 4;
  const int count_a = 3;
  const int count_b = 3;
  const float score_threshold = 0.3;
  
  std::size_t workspace_size = assignment_out_workspace(M);
  void *workspace = (void *) malloc(workspace_size);

  int connections[2 * M];
  const float score_graph[M * M] = {
    1., 3., 0., 0.,
    1., 2., 1., 0.,
    4., 3., 4., 0.,
    0., 0., 0., 0.,
  };

  assignment_out(connections, score_graph, count_a, count_b, M, score_threshold, workspace);

  if (connections[0] != 1) {
    throw std::runtime_error("connections[0] should be 1.");
  }
  if (connections[1] != 0) {
    throw std::runtime_error("connections[0] should be 1.");
  }
  if (connections[2] != 2) {
    throw std::runtime_error("connections[0] should be 1.");
  }

  free(workspace);
}